

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnintf.c
# Opt level: O0

UINT8 get_ssg_funcs(DEV_DEF *devDef,ssg_callbacks *retFuncs)

{
  UINT8 retVal;
  ssg_callbacks *retFuncs_local;
  DEV_DEF *devDef_local;
  
  devDef_local._7_1_ = SndEmu_GetDeviceFunc(devDef,'\0','\x11',0,&retFuncs->write);
  if (((devDef_local._7_1_ == '\0') &&
      (devDef_local._7_1_ = SndEmu_GetDeviceFunc(devDef,'\x01','\x11',0,&retFuncs->read),
      devDef_local._7_1_ == '\0')) &&
     (devDef_local._7_1_ = SndEmu_GetDeviceFunc(devDef,0x80,'\0',0,&retFuncs->set_clock),
     devDef_local._7_1_ == '\0')) {
    if (devDef->Reset == (DEVFUNC_CTRL)0x0) {
      devDef_local._7_1_ = 0xff;
    }
    else {
      retFuncs->reset = devDef->Reset;
      devDef_local._7_1_ = '\0';
    }
  }
  return devDef_local._7_1_;
}

Assistant:

static UINT8 get_ssg_funcs(const DEV_DEF* devDef, ssg_callbacks* retFuncs)
{
	UINT8 retVal;
	
	retVal = SndEmu_GetDeviceFunc(devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&retFuncs->write);
	if (retVal)
		return retVal;
	retVal = SndEmu_GetDeviceFunc(devDef, RWF_REGISTER | RWF_READ, DEVRW_A8D8, 0, (void**)&retFuncs->read);
	if (retVal)
		return retVal;
	retVal = SndEmu_GetDeviceFunc(devDef, RWF_CLOCK | RWF_WRITE, DEVRW_VALUE, 0, (void**)&retFuncs->set_clock);
	if (retVal)
		return retVal;
	
	if (devDef->Reset == NULL)
		return 0xFF;
	retFuncs->reset = devDef->Reset;
	return 0x00;
}